

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

ParseResult * toml::parse(istream *is)

{
  bool bVar1;
  ulong uVar2;
  long *in_RSI;
  ParseResult *in_RDI;
  Value v;
  Parser parser;
  Parser *in_stack_fffffffffffffe80;
  Value *in_stack_fffffffffffffe88;
  Value *this;
  ParseResult *in_stack_fffffffffffffe90;
  ParseResult *this_00;
  Value *in_stack_fffffffffffffea0;
  Value *this_01;
  string local_140 [32];
  Value local_120;
  undefined4 local_10c;
  string local_108 [16];
  istream *in_stack_ffffffffffffff08;
  Parser *in_stack_ffffffffffffff10;
  Value local_e8;
  Value local_d8;
  Value local_c8 [5];
  Parser *in_stack_ffffffffffffff88;
  allocator local_41;
  string local_40 [32];
  Value local_20 [2];
  
  uVar2 = std::ios::operator!((ios *)((long)in_RSI + *(long *)(*in_RSI + -0x18)));
  if ((uVar2 & 1) == 0) {
    this_01 = local_c8;
    internal::Parser::Parser(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    internal::Parser::parse(in_stack_ffffffffffffff88);
    bVar1 = Value::valid(&local_d8);
    if (bVar1) {
      this = &local_e8;
      Value::Value(this,&local_d8);
      this_00 = (ParseResult *)local_108;
      std::__cxx11::string::string((string *)this_00);
      ParseResult::ParseResult(this_00,this,(string *)in_stack_fffffffffffffe80);
      std::__cxx11::string::~string(local_108);
      Value::~Value(this_01);
    }
    else {
      Value::Value(&local_120,&local_d8);
      in_stack_fffffffffffffe80 =
           (Parser *)internal::Parser::errorReason_abi_cxx11_((Parser *)local_c8);
      std::__cxx11::string::string(local_140,(string *)in_stack_fffffffffffffe80);
      ParseResult::ParseResult
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (string *)in_stack_fffffffffffffe80);
      std::__cxx11::string::~string(local_140);
      Value::~Value(this_01);
    }
    local_10c = 1;
    Value::~Value(this_01);
    internal::Parser::~Parser(in_stack_fffffffffffffe80);
  }
  else {
    Value::Value(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"stream is in bad state. file does not exist?",&local_41);
    ParseResult::ParseResult
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (string *)in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Value::~Value(in_stack_fffffffffffffea0);
  }
  return in_RDI;
}

Assistant:

inline ParseResult parse(std::istream& is)
{
    if (!is) {
        return ParseResult(toml::Value(), "stream is in bad state. file does not exist?");
    }

    internal::Parser parser(is);
    toml::Value v = parser.parse();

    if (v.valid())
        return ParseResult(std::move(v), std::string());

    return ParseResult(std::move(v), std::move(parser.errorReason()));
}